

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::SignedCastExpressionSyntax::getChild(SignedCastExpressionSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  long in_RDX;
  Info *in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  TokenOrSyntax *pTVar1;
  
  if (in_RDX == 0) {
    token.info = in_RSI;
    token._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token);
  }
  else if (in_RDX == 1) {
    token_00.info = in_RSI;
    token_00._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_00);
  }
  else if (in_RDX == 2) {
    pTVar1 = in_RDI;
    not_null<slang::syntax::ParenthesizedExpressionSyntax_*>::get
              ((not_null<slang::syntax::ParenthesizedExpressionSyntax_*> *)&in_RSI[3].location);
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffffa8);
    in_RDI = pTVar1;
  }
  else {
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax SignedCastExpressionSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return signing;
        case 1: return apostrophe;
        case 2: return inner.get();
        default: return nullptr;
    }
}